

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintSExpression::printDebugLocation
          (PrintSExpression *this,optional<wasm::Function::DebugLocation> *location)

{
  uint uVar1;
  undefined8 uVar2;
  __optional_eq_t<wasm::Function::DebugLocation,_wasm::Function::DebugLocation> _Var3;
  ostream *poVar4;
  string local_60 [8];
  value_type fileName;
  value_type symbolName;
  
  if (this->minify == false) {
    _Var3 = std::operator==(&this->lastPrintedLocation,location);
    uVar1 = this->indent;
    if (((!_Var3) || (uVar1 <= this->lastPrintIndent)) || (this->full == true)) {
      *(undefined8 *)
       ((long)&(this->lastPrintedLocation).
               super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
               symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> + 4) =
           *(undefined8 *)
            ((long)&(location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                    _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                    _M_payload._M_value.symbolNameIndex.
                    super__Optional_base<unsigned_int,_true,_true>._M_payload + 4);
      uVar2 = *(undefined8 *)
               ((long)&(location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                       _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                       _M_payload + 8);
      *(undefined8 *)
       &(this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
           *(undefined8 *)
            &(location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
             super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
      *(undefined8 *)
       ((long)&(this->lastPrintedLocation).
               super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8) = uVar2;
      this->lastPrintIndent = uVar1;
      if ((location->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
          super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == false) {
        std::operator<<(this->o,";;@\n");
      }
      else {
        std::__cxx11::string::string
                  (local_60,(string *)
                            ((this->currModule->debugInfoFileNames).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start +
                            (location->
                            super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                            _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                            _M_payload._M_value.fileIndex));
        poVar4 = std::operator<<(this->o,";;@ ");
        poVar4 = std::operator<<(poVar4,local_60);
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,":");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        if (*(char *)((long)&(location->
                             super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                             _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>.
                             _M_payload + 0x10) == '\x01') {
          std::__cxx11::string::string
                    ((string *)(fileName.field_2._M_local_buf + 8),
                     (string *)
                     ((this->currModule->debugInfoSymbolNames).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                     *(uint *)&(location->
                               super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                               _M_payload.
                               super__Optional_payload_base<wasm::Function::DebugLocation>.
                               _M_payload._M_value.symbolNameIndex.
                               super__Optional_base<unsigned_int,_true,_true>._M_payload.
                               super__Optional_payload_base<unsigned_int>));
          poVar4 = std::operator<<(this->o,":");
          std::operator<<(poVar4,(string *)(fileName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(fileName.field_2._M_local_buf + 8));
        }
        std::operator<<(this->o,'\n');
        std::__cxx11::string::~string(local_60);
      }
      doIndent(this->o,this->indent);
    }
  }
  return;
}

Assistant:

void PrintSExpression::printDebugLocation(
  const std::optional<Function::DebugLocation>& location) {
  if (minify) {
    return;
  }
  // Do not skip repeated debug info in full mode, for less-confusing debugging:
  // full mode prints out everything in the most verbose manner.
  if (lastPrintedLocation == location && indent > lastPrintIndent && !full) {
    return;
  }
  lastPrintedLocation = location;
  lastPrintIndent = indent;
  if (!location) {
    o << ";;@\n";
  } else {
    auto fileName = currModule->debugInfoFileNames[location->fileIndex];
    o << ";;@ " << fileName << ":" << location->lineNumber << ":"
      << location->columnNumber;

    if (location->symbolNameIndex) {
      auto symbolName =
        currModule->debugInfoSymbolNames[*(location->symbolNameIndex)];
      o << ":" << symbolName;
    }

    o << '\n';
  }
  doIndent(o, indent);
}